

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u8 tabOpts,Select *pSelect)

{
  byte *pbVar1;
  u16 uVar2;
  short sVar3;
  int iVar4;
  Table *pTab;
  sqlite3 *db;
  int *piVar5;
  code *pcVar6;
  Schema *pSVar7;
  sqlite3 *db_00;
  Column *pCVar8;
  Index *pIdx;
  LogEst LVar9;
  uint uVar10;
  int p2;
  HashElem *pHVar11;
  void *pvVar12;
  Vdbe *pVVar13;
  Parse *pPVar14;
  Table *pTVar15;
  Token *pTVar16;
  size_t sVar17;
  Expr *pExpr;
  ExprList *pList;
  ushort uVar18;
  int iVar19;
  Schema **ppSVar20;
  Op *pOVar21;
  short sVar22;
  u8 *puVar23;
  long lVar24;
  ulong uVar25;
  char *pcVar26;
  uint uVar27;
  char *pcVar28;
  ulong uVar29;
  short *psVar30;
  short *psVar31;
  ulong uVar32;
  int iVar33;
  Index *pIVar34;
  int iVar35;
  Op *pOVar36;
  bool bVar37;
  u8 *local_90;
  SelectDest dest;
  
  if (pEnd == (Token *)0x0 && pSelect == (Select *)0x0) {
    return;
  }
  pTab = pParse->pNewTable;
  if (pTab == (Table *)0x0) {
    return;
  }
  db = pParse->db;
  if (pSelect == (Select *)0x0) {
    pcVar26 = pTab->zName;
    pcVar28 = strrchr(pcVar26,0x5f);
    if (pcVar28 != (char *)0x0) {
      *pcVar28 = '\0';
      pTVar15 = sqlite3FindTable(db,pcVar26,(char *)0x0);
      *pcVar28 = '_';
      if ((pTVar15 != (Table *)0x0) && (pTVar15->nModuleArg != 0)) {
        pHVar11 = findElementWithHash(&db->aModule,*pTVar15->azModuleArg,(uint *)0x0);
        if (((undefined8 *)pHVar11->data != (undefined8 *)0x0) &&
           (((piVar5 = *pHVar11->data, 2 < *piVar5 &&
             (pcVar6 = *(code **)(piVar5 + 0x2e), pcVar6 != (code *)0x0)) &&
            (iVar35 = (*pcVar6)(), iVar35 != 0)))) {
          pbVar1 = (byte *)((long)&pTab->tabFlags + 1);
          *pbVar1 = *pbVar1 | 4;
        }
      }
    }
    if (((db->init).busy != '\0') && (iVar35 = (db->init).newTnum, pTab->tnum = iVar35, iVar35 == 1)
       ) {
      *(byte *)&pTab->tabFlags = (byte)pTab->tabFlags | 1;
    }
  }
  else if ((db->init).busy != '\0') {
    pcVar26 = "";
    goto LAB_0016ffaa;
  }
  local_90 = &(db->init).busy;
  if ((tabOpts & 0x20) == 0) goto LAB_0016fbb6;
  uVar10 = pTab->tabFlags;
  if ((uVar10 & 8) != 0) {
    pcVar26 = "AUTOINCREMENT not allowed on WITHOUT ROWID tables";
LAB_0016ffaa:
    sqlite3ErrorMsg(pParse,pcVar26);
    return;
  }
  if ((uVar10 & 4) == 0) {
    sqlite3ErrorMsg(pParse,"PRIMARY KEY missing on table %s",pTab->zName);
    goto LAB_0016fbb6;
  }
  pTab->tabFlags = uVar10 | 0x60;
  db_00 = pParse->db;
  pVVar13 = pParse->pVdbe;
  if ((((db_00->init).field_0x6 & 2) == 0) && (sVar22 = pTab->nCol, 0 < (long)sVar22)) {
    pCVar8 = pTab->aCol;
    lVar24 = 0;
    do {
      if (((&pCVar8->colFlags)[lVar24] & 1) != 0) {
        (&pCVar8->notNull)[lVar24] = '\x02';
      }
      lVar24 = lVar24 + 0x20;
    } while ((long)sVar22 * 0x20 != lVar24);
  }
  iVar35 = pParse->addrCrTab;
  if (iVar35 != 0) {
    if (iVar35 < 0) {
      iVar35 = pVVar13->nOp + -1;
    }
    if (pVVar13->db->mallocFailed == '\0') {
      pOVar21 = pVVar13->aOp + iVar35;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->p3 = 2;
  }
  if ((long)pTab->iPKey < 0) {
    for (pIVar34 = pTab->pIndex; pIVar34 != (Index *)0x0; pIVar34 = pIVar34->pNext) {
      if ((*(ushort *)&pIVar34->field_0x63 & 3) == 2) goto LAB_00170230;
    }
    pIVar34 = (Index *)0x0;
LAB_00170230:
    uVar18 = pIVar34->nKeyCol;
    iVar35 = 1;
    if (1 < uVar18) {
      psVar30 = pIVar34->aiColumn;
      iVar35 = 1;
      uVar25 = 1;
      do {
        psVar31 = psVar30;
        iVar19 = iVar35;
        do {
          if (iVar19 < 1) {
            lVar24 = (long)iVar35;
            iVar35 = iVar35 + 1;
            psVar30[lVar24] = psVar30[uVar25];
            uVar18 = pIVar34->nKeyCol;
            goto LAB_00170281;
          }
          iVar19 = iVar19 + -1;
          sVar22 = *psVar31;
          psVar31 = psVar31 + 1;
        } while (sVar22 != psVar30[uVar25]);
        pIVar34->nColumn = pIVar34->nColumn - 1;
LAB_00170281:
        uVar25 = uVar25 + 1;
      } while (uVar25 < uVar18);
    }
    pIVar34->nKeyCol = (u16)iVar35;
  }
  else {
    dest._0_8_ = pTab->aCol[pTab->iPKey].zName;
    if ((char *)dest._0_8_ == (char *)0x0) {
      uVar10 = 0;
    }
    else {
      sVar17 = strlen((char *)dest._0_8_);
      uVar10 = (uint)sVar17 & 0x3fffffff;
    }
    dest.iSdst = uVar10;
    pExpr = sqlite3ExprAlloc(db_00,0x3b,(Token *)&dest,0);
    pList = sqlite3ExprListAppend((Parse *)pParse->db,(ExprList *)0x0,pExpr);
    if (pList == (ExprList *)0x0) goto LAB_0016fbb6;
    pList->a[0].sortOrder = pParse->iPkSortOrder;
    sqlite3CreateIndex(pParse,(Token *)0x0,(Token *)0x0,(SrcList *)0x0,pList,(uint)pTab->keyConf,
                       (Token *)0x0,(Expr *)0x0,0,0,'\x02');
    if ((db_00->mallocFailed != '\0') || (pParse->nErr != 0)) goto LAB_0016fbb6;
    for (pIVar34 = pTab->pIndex; pIVar34 != (Index *)0x0; pIVar34 = pIVar34->pNext) {
      if ((*(ushort *)&pIVar34->field_0x63 & 3) == 2) goto LAB_00170586;
    }
    pIVar34 = (Index *)0x0;
LAB_00170586:
    pTab->iPKey = -1;
  }
  uVar18 = *(ushort *)&pIVar34->field_0x63;
  *(ushort *)&pIVar34->field_0x63 = uVar18 | 0x20;
  if (((db_00->init).field_0x6 & 2) == 0) {
    *(ushort *)&pIVar34->field_0x63 = uVar18 | 0x28;
  }
  uVar18 = pIVar34->nKeyCol;
  uVar25 = (ulong)uVar18;
  if ((pVVar13 != (Vdbe *)0x0) && (0 < (long)pIVar34->tnum)) {
    if (pVVar13->db->mallocFailed == '\0') {
      pOVar21 = pVVar13->aOp + pIVar34->tnum;
    }
    else {
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar21->opcode = '\v';
  }
  pIVar34->tnum = pTab->tnum;
  for (pIdx = pTab->pIndex; pIdx != (Index *)0x0; pIdx = pIdx->pNext) {
    if ((*(ushort *)&pIdx->field_0x63 & 3) != 2) {
      if (uVar25 != 0) {
        uVar29 = 0;
        iVar35 = 0;
        do {
          uVar10 = (uint)pIdx->nKeyCol;
          psVar30 = pIdx->aiColumn;
          do {
            if ((int)uVar10 < 1) {
              iVar35 = iVar35 + 1;
              break;
            }
            uVar10 = uVar10 - 1;
            sVar22 = *psVar30;
            psVar30 = psVar30 + 1;
          } while (sVar22 != pIVar34->aiColumn[uVar29]);
          uVar29 = uVar29 + 1;
        } while (uVar29 != uVar25);
        if (iVar35 != 0) {
          iVar35 = resizeIndexObject(db_00,pIdx,iVar35 + (uint)pIdx->nKeyCol);
          if (iVar35 == 0) {
            if (uVar25 != 0) {
              uVar10 = (uint)pIdx->nKeyCol;
              uVar29 = 0;
              do {
                uVar27 = (uint)pIdx->nKeyCol;
                psVar30 = pIdx->aiColumn;
                do {
                  if ((int)uVar27 < 1) {
                    pIdx->aiColumn[(int)uVar10] = pIVar34->aiColumn[uVar29];
                    pIdx->azColl[(int)uVar10] = pIVar34->azColl[uVar29];
                    uVar10 = uVar10 + 1;
                    break;
                  }
                  uVar27 = uVar27 - 1;
                  sVar22 = *psVar30;
                  psVar30 = psVar30 + 1;
                } while (sVar22 != pIVar34->aiColumn[uVar29]);
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar25);
            }
            goto LAB_001704ab;
          }
          goto LAB_0016fbb6;
        }
      }
      pIdx->nColumn = pIdx->nKeyCol;
    }
LAB_001704ab:
  }
  uVar2 = pTab->nCol;
  if ((int)(uint)uVar18 < (int)(short)uVar2) {
    iVar35 = resizeIndexObject(db_00,pIVar34,(int)(short)uVar2);
    if (iVar35 != 0) goto LAB_0016fbb6;
    sVar22 = pTab->nCol;
    if (0 < sVar22) {
      iVar35 = 0;
      do {
        iVar19 = (int)uVar25;
        psVar30 = pIVar34->aiColumn;
        uVar29 = uVar25;
        do {
          if ((int)uVar29 < 1) {
            pIVar34->aiColumn[iVar19] = (short)iVar35;
            pIVar34->azColl[iVar19] = "BINARY";
            uVar25 = (ulong)(iVar19 + 1);
            sVar22 = pTab->nCol;
            break;
          }
          uVar29 = (ulong)((int)uVar29 - 1);
          sVar3 = *psVar30;
          psVar30 = psVar30 + 1;
        } while (iVar35 != sVar3);
        iVar35 = iVar35 + 1;
      } while (iVar35 < sVar22);
    }
  }
  else {
    pIVar34->nColumn = uVar2;
  }
  if ((ulong)pIVar34->nColumn == 0) {
    uVar25 = 0xffffffffffffffff;
  }
  else {
    uVar29 = (ulong)pIVar34->nColumn + 1;
    uVar25 = 0;
    do {
      uVar32 = 1L << ((byte)pIVar34->aiColumn[uVar29 - 2] & 0x3f);
      if (0x3e < (ushort)pIVar34->aiColumn[uVar29 - 2]) {
        uVar32 = 0;
      }
      uVar25 = uVar25 | uVar32;
      uVar29 = uVar29 - 1;
    } while (1 < uVar29);
    uVar25 = ~uVar25;
  }
  pIVar34->colNotIdxed = uVar25;
LAB_0016fbb6:
  if (pTab->pSchema == (Schema *)0x0) {
    iVar35 = -1000000;
  }
  else {
    iVar35 = -1;
    ppSVar20 = &db->aDb->pSchema;
    do {
      iVar35 = iVar35 + 1;
      pSVar7 = *ppSVar20;
      ppSVar20 = ppSVar20 + 4;
    } while (pSVar7 != pTab->pSchema);
  }
  if (pTab->pCheck != (ExprList *)0x0) {
    sqlite3ResolveSelfReference(pParse,pTab,4,(Expr *)0x0,pTab->pCheck);
  }
  if (pTab->nCol < 1) {
    iVar19 = 0;
  }
  else {
    uVar10 = (int)pTab->nCol + 1;
    puVar23 = &pTab->aCol->szEst;
    iVar19 = 0;
    do {
      iVar19 = iVar19 + (uint)*puVar23;
      uVar10 = uVar10 - 1;
      puVar23 = puVar23 + 0x20;
    } while (1 < uVar10);
  }
  LVar9 = sqlite3LogEst((ulong)(((uint)((ushort)pTab->iPKey >> 0xf) + iVar19) * 4));
  pTab->szTabRow = LVar9;
  for (pIVar34 = pTab->pIndex; pIVar34 != (Index *)0x0; pIVar34 = pIVar34->pNext) {
    estimateIndexWidth(pIVar34);
  }
  if (*local_90 == '\0') {
    pVVar13 = sqlite3GetVdbe(pParse);
    if (pVVar13 == (Vdbe *)0x0) {
      return;
    }
    sqlite3VdbeAddOp3(pVVar13,0x75,0,0,0);
    bVar37 = pTab->pSelect == (Select *)0x0;
    pcVar26 = "VIEW";
    if (bVar37) {
      pcVar26 = "TABLE";
    }
    pcVar28 = "view";
    if (bVar37) {
      pcVar28 = "table";
    }
    if (pSelect == (Select *)0x0) {
      pTVar16 = &pParse->sLastToken;
      if (tabOpts == '\0') {
        pTVar16 = pEnd;
      }
      uVar10 = (int)pTVar16->z - (int)(pParse->sNameToken).z;
      if (*pTVar16->z != ';') {
        uVar10 = uVar10 + pTVar16->n;
      }
      pcVar26 = sqlite3MPrintf(db,"CREATE %s %.*s",pcVar26,(ulong)uVar10);
    }
    else {
      iVar19 = pParse->nMem;
      iVar33 = iVar19 + 1;
      p2 = iVar19 + 3;
      pParse->nMem = p2;
      pPVar14 = pParse->pToplevel;
      if (pParse->pToplevel == (Parse *)0x0) {
        pPVar14 = pParse;
      }
      pPVar14->mayAbort = '\x01';
      sqlite3VdbeAddOp3(pVVar13,0x6d,1,pParse->regRoot,iVar35);
      iVar4 = pVVar13->nOp;
      if (0 < (long)iVar4) {
        pVVar13->aOp[(long)iVar4 + -1].p5 = 0x10;
      }
      pParse->nTab = 2;
      sqlite3VdbeAddOp3(pVVar13,0xd,iVar33,0,iVar4 + 1);
      if (pParse->nErr != 0) {
        return;
      }
      pTVar15 = sqlite3ResultSetOfSelect(pParse,pSelect);
      if (pTVar15 == (Table *)0x0) {
        return;
      }
      pTab->nCol = pTVar15->nCol;
      pTab->aCol = pTVar15->aCol;
      pTVar15->nCol = 0;
      pTVar15->aCol = (Column *)0x0;
      sqlite3DeleteTable(db,pTVar15);
      dest.eDest = '\r';
      dest.iSDParm = iVar33;
      dest.iSdst = 0;
      dest.nSdst = 0;
      dest.zAffSdst = (char *)0x0;
      sqlite3Select(pParse,pSelect,&dest);
      if (pParse->nErr != 0) {
        return;
      }
      sqlite3VdbeAddOp3(pVVar13,0x43,iVar33,0,0);
      pPVar14 = pVVar13->pParse;
      pPVar14->nTempReg = '\0';
      pPVar14->nRangeReg = 0;
      pOVar36 = (Op *)&sqlite3VdbeGetOp_dummy;
      pOVar21 = (Op *)&sqlite3VdbeGetOp_dummy;
      if (pVVar13->db->mallocFailed == '\0') {
        iVar33 = pVVar13->nOp + -1;
        if (-1 < iVar4) {
          iVar33 = iVar4;
        }
        pOVar21 = pVVar13->aOp + iVar33;
      }
      pOVar21->p2 = pVVar13->nOp;
      iVar33 = sqlite3VdbeAddOp3(pVVar13,0xe,dest.iSDParm,0,0);
      sqlite3VdbeAddOp3(pVVar13,0x5c,dest.iSdst,dest.nSdst,iVar19 + 2);
      sqlite3TableAffinity(pVVar13,pTab,0);
      sqlite3VdbeAddOp3(pVVar13,0x79,1,p2,0);
      sqlite3VdbeAddOp3(pVVar13,0x7a,1,iVar19 + 2,p2);
      sqlite3VdbeAddOp3(pVVar13,0xb,0,iVar33,0);
      if (pVVar13->db->mallocFailed == '\0') {
        iVar19 = pVVar13->nOp + -1;
        if (-1 < iVar33) {
          iVar19 = iVar33;
        }
        pOVar36 = pVVar13->aOp + iVar19;
      }
      pOVar36->p2 = pVVar13->nOp;
      sqlite3VdbeAddOp3(pVVar13,0x75,1,0,0);
      pcVar26 = createTableStmt(db,pTab);
    }
    sqlite3NestedParse(pParse,
                       "UPDATE %Q.%s SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db->aDb[iVar35].zDbSName,"sqlite_master",pcVar28,pTab->zName,pTab->zName,
                       (ulong)(uint)pParse->regRoot,pcVar26,(ulong)(uint)pParse->regRowid);
    if (pcVar26 != (char *)0x0) {
      sqlite3DbFreeNN(db,pcVar26);
    }
    sqlite3VdbeAddOp3(pParse->pVdbe,0x5f,iVar35,1,
                      (pParse->db->aDb[iVar35].pSchema)->schema_cookie + 1);
    if (((pTab->tabFlags & 8) != 0) && ((db->aDb[iVar35].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(pParse,"CREATE TABLE %Q.sqlite_sequence(name,seq)",db->aDb[iVar35].zDbSName
                        );
    }
    pcVar26 = sqlite3MPrintf(db,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp(pVVar13,iVar35,pcVar26);
    if ((db->init).busy == '\0') {
      return;
    }
  }
  pvVar12 = sqlite3HashInsert(&pTab->pSchema->tblHash,pTab->zName,pTab);
  if (pvVar12 == (void *)0x0) {
    pParse->pNewTable = (Table *)0x0;
    *(byte *)&db->mDbFlags = (byte)db->mDbFlags | 1;
    if (pTab->pSelect == (Select *)0x0) {
      pcVar26 = (pParse->sNameToken).z;
      if (pCons->z != (char *)0x0) {
        pEnd = pCons;
      }
      iVar35 = sqlite3Utf8CharLen(pcVar26,*(int *)&pEnd->z - (int)pcVar26);
      pTab->addColOffset = iVar35 + 0xd;
    }
  }
  else {
    sqlite3OomFault(db);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u8 tabOpts,             /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  assert( !db->mallocFailed );
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && isShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_master" or "sqlite_temp_master" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_master
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
    }else{
      p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
      convertToWithoutRowidTable(pParse, p);
    }
  }

  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the SQLITE_MASTER table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /* 
    ** Initialize zType for the new view or table.
    */
    if( p->pSelect==0 ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */

      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      assert(pParse->nTab==1);
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, 1, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      pParse->nTab = 2;
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, 1, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, 1, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, 1);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db, 
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the 
    ** SQLITE_MASTER table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q.%s "
         "SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q "
       "WHERE rowid=#%d",
      db->aDb[iDb].zDbSName, MASTER_NAME,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName));
  }


  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

#ifndef SQLITE_OMIT_ALTERTABLE
    if( !p->pSelect ){
      const char *zName = (const char *)pParse->sNameToken.z;
      int nName;
      assert( !pSelect && pCons && pEnd );
      if( pCons->z==0 ){
        pCons = pEnd;
      }
      nName = (int)((const char *)pCons->z - zName);
      p->addColOffset = 13 + sqlite3Utf8CharLen(zName, nName);
    }
#endif
  }
}